

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

bool __thiscall cmCTestMultiProcessHandler::CheckStopTimePassed(cmCTestMultiProcessHandler *this)

{
  long lVar1;
  long lVar2;
  
  if ((this->StopTimePassed == false) && (lVar1 = (this->CTest->StopTime).__d.__r, lVar1 != 0)) {
    lVar2 = std::chrono::_V2::system_clock::now();
    if (lVar1 <= lVar2) {
      SetStopTimePassed(this);
    }
  }
  return this->StopTimePassed;
}

Assistant:

bool cmCTestMultiProcessHandler::CheckStopTimePassed()
{
  if (!this->StopTimePassed) {
    std::chrono::system_clock::time_point stop_time =
      this->CTest->GetStopTime();
    if (stop_time != std::chrono::system_clock::time_point() &&
        stop_time <= std::chrono::system_clock::now()) {
      this->SetStopTimePassed();
    }
  }
  return this->StopTimePassed;
}